

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_DataStructures_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::StringToInt64Map>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::StringToInt64Map> *)
           _StringToInt64Map_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Int64ToStringMap>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::Int64ToStringMap> *)
           _Int64ToStringMap_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::StringToDoubleMap>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::StringToDoubleMap> *)
           _StringToDoubleMap_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Int64ToDoubleMap>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::Int64ToDoubleMap> *)
           _Int64ToDoubleMap_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::StringVector>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::StringVector> *)
             _StringVector_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Int64Vector>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::Int64Vector> *)
             _Int64Vector_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::FloatVector>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::FloatVector> *)
             _FloatVector_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::DoubleVector>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::DoubleVector> *)
             _DoubleVector_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Int64Range>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::Int64Range> *)
             _Int64Range_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Int64Set>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::Int64Set> *)_Int64Set_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::DoubleRange>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::DoubleRange> *)
             _DoubleRange_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _StringToInt64Map_default_instance_.Shutdown();
  _Int64ToStringMap_default_instance_.Shutdown();
  _StringToDoubleMap_default_instance_.Shutdown();
  _Int64ToDoubleMap_default_instance_.Shutdown();
  _StringVector_default_instance_.Shutdown();
  _Int64Vector_default_instance_.Shutdown();
  _FloatVector_default_instance_.Shutdown();
  _DoubleVector_default_instance_.Shutdown();
  _Int64Range_default_instance_.Shutdown();
  _Int64Set_default_instance_.Shutdown();
  _DoubleRange_default_instance_.Shutdown();
}